

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O0

Dar_Cut_t * Dar_ObjComputeCuts(Dar_Man_t *p,Aig_Obj_t *pObj,int fSkipTtMin)

{
  int iVar1;
  int fCompl1;
  uint uVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pObj_01;
  Dar_Cut_t *pDVar5;
  Dar_Cut_t *pCut_00;
  int local_70;
  int RetValue;
  int k;
  int i;
  Dar_Cut_t *pCut;
  Dar_Cut_t *pCut1;
  Dar_Cut_t *pCut0;
  Dar_Cut_t *pCutSet;
  Aig_Obj_t *pFaninR1;
  Aig_Obj_t *pFaninR0;
  Aig_Obj_t *pFanin1;
  Aig_Obj_t *pFanin0;
  int fSkipTtMin_local;
  Aig_Obj_t *pObj_local;
  Dar_Man_t *p_local;
  
  pAVar3 = Aig_ObjChild0(pObj);
  pAVar3 = Aig_ObjReal_rec(pAVar3);
  pAVar4 = Aig_ObjChild1(pObj);
  pAVar4 = Aig_ObjReal_rec(pAVar4);
  pObj_00 = Aig_Regular(pAVar3);
  pObj_01 = Aig_Regular(pAVar4);
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                  ,0x2eb,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
  }
  iVar1 = Aig_ObjIsNode(pObj);
  if (iVar1 == 0) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                  ,0x2ec,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
  }
  pDVar5 = Dar_ObjCuts(pObj);
  if (pDVar5 != (Dar_Cut_t *)0x0) {
    __assert_fail("Dar_ObjCuts(pObj) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                  ,0x2ed,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
  }
  pDVar5 = Dar_ObjCuts(pObj_00);
  if (pDVar5 != (Dar_Cut_t *)0x0) {
    pDVar5 = Dar_ObjCuts(pObj_01);
    if (pDVar5 == (Dar_Cut_t *)0x0) {
      __assert_fail("Dar_ObjCuts(pFaninR1) != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                    ,0x2ef,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
    }
    pDVar5 = Dar_ObjPrepareCuts(p,pObj);
    pCut1 = Dar_ObjCuts(pObj_00);
    RetValue = 0;
    do {
      if ((int)(uint)(byte)((ulong)*(undefined8 *)&pObj_00->field_0x18 >> 0x38) <= RetValue) {
        _k = Dar_ObjCuts(pObj);
        for (RetValue = 0;
            RetValue < (int)(uint)(byte)((ulong)*(undefined8 *)&pObj->field_0x18 >> 0x38);
            RetValue = RetValue + 1) {
          if ((*(uint *)&_k->field_0x4 >> 0x1c & 1) != 0) {
            p->nCutsUsed = (*(uint *)&_k->field_0x4 >> 0x1c & 1) + p->nCutsUsed;
          }
          _k = _k + 1;
        }
        p->nCutsUsed = p->nCutsUsed + -1;
        return pDVar5;
      }
      if ((*(uint *)&pCut1->field_0x4 >> 0x1c & 1) != 0) {
        pCut = Dar_ObjCuts(pObj_01);
        for (local_70 = 0;
            local_70 < (int)(uint)(byte)((ulong)*(undefined8 *)&pObj_01->field_0x18 >> 0x38);
            local_70 = local_70 + 1) {
          if ((*(uint *)&pCut->field_0x4 >> 0x1c & 1) != 0) {
            p->nCutsAll = p->nCutsAll + 1;
            iVar1 = Dar_WordCountOnes(pCut1->uSign | pCut->uSign);
            if (iVar1 < 5) {
              pCut_00 = Dar_CutFindFree(p,pObj);
              iVar1 = Dar_CutMerge(pCut_00,pCut1,pCut);
              if (iVar1 == 0) {
                if ((*(uint *)&pCut_00->field_0x4 >> 0x1c & 1) != 0) {
                  __assert_fail("!pCut->fUsed",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                                ,0x300,
                                "Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
                }
              }
              else {
                p->nCutsTried = p->nCutsTried + 1;
                iVar1 = Dar_CutFilter(pObj,pCut_00);
                if (iVar1 == 0) {
                  iVar1 = Aig_IsComplement(pAVar3);
                  fCompl1 = Aig_IsComplement(pAVar4);
                  uVar2 = Dar_CutTruth(pCut_00,pCut1,pCut,iVar1,fCompl1);
                  *(uint *)&pCut_00->field_0x4 =
                       *(uint *)&pCut_00->field_0x4 & 0xffff0000 | uVar2 & 0xffff;
                  if (((fSkipTtMin == 0) && (iVar1 = Dar_CutSuppMinimize(pCut_00), iVar1 != 0)) &&
                     (iVar1 = Dar_CutFilter(pObj,pCut_00), iVar1 != 0)) {
                    __assert_fail("!RetValue",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                                  ,0x311,
                                  "Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
                  }
                  uVar2 = Dar_CutFindValue(p,pCut_00);
                  *(uint *)&pCut_00->field_0x4 =
                       *(uint *)&pCut_00->field_0x4 & 0xf800ffff | (uVar2 & 0x7ff) << 0x10;
                  if ((*(uint *)&pCut_00->field_0x4 >> 0x10 & 0x7ff) == 0) {
                    p->nCutsSkipped = p->nCutsSkipped + 1;
                    *(uint *)&pCut_00->field_0x4 = *(uint *)&pCut_00->field_0x4 & 0xefffffff;
                  }
                  else if (*(uint *)&pCut_00->field_0x4 >> 0x1d < 2) {
                    return pDVar5;
                  }
                }
                else if ((*(uint *)&pCut_00->field_0x4 >> 0x1c & 1) != 0) {
                  __assert_fail("!pCut->fUsed",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                                ,0x307,
                                "Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
                }
              }
            }
          }
          pCut = pCut + 1;
        }
      }
      RetValue = RetValue + 1;
      pCut1 = pCut1 + 1;
    } while( true );
  }
  __assert_fail("Dar_ObjCuts(pFaninR0) != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                ,0x2ee,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
}

Assistant:

Dar_Cut_t * Dar_ObjComputeCuts( Dar_Man_t * p, Aig_Obj_t * pObj, int fSkipTtMin )
{
    Aig_Obj_t * pFanin0 = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
    Aig_Obj_t * pFanin1 = Aig_ObjReal_rec( Aig_ObjChild1(pObj) );
    Aig_Obj_t * pFaninR0 = Aig_Regular(pFanin0);
    Aig_Obj_t * pFaninR1 = Aig_Regular(pFanin1);
    Dar_Cut_t * pCutSet, * pCut0, * pCut1, * pCut;
    int i, k; 

    assert( !Aig_IsComplement(pObj) );
    assert( Aig_ObjIsNode(pObj) );
    assert( Dar_ObjCuts(pObj) == NULL );
    assert( Dar_ObjCuts(pFaninR0) != NULL );
    assert( Dar_ObjCuts(pFaninR1) != NULL );

    // set up the first cut
    pCutSet = Dar_ObjPrepareCuts( p, pObj );
    // make sure fanins cuts are computed
    Dar_ObjForEachCut( pFaninR0, pCut0, i )
    Dar_ObjForEachCut( pFaninR1, pCut1, k )
    {
        p->nCutsAll++;
        // make sure K-feasible cut exists
        if ( Dar_WordCountOnes(pCut0->uSign | pCut1->uSign) > 4 )
            continue;
        // get the next cut of this node
        pCut = Dar_CutFindFree( p, pObj );
        // create the new cut
        if ( !Dar_CutMerge( pCut, pCut0, pCut1 ) )
        {
            assert( !pCut->fUsed );
            continue;
        }
        p->nCutsTried++;
        // check dominance
        if ( Dar_CutFilter( pObj, pCut ) )
        {
            assert( !pCut->fUsed );
            continue;
        }
        // compute truth table
        pCut->uTruth = 0xFFFF & Dar_CutTruth( pCut, pCut0, pCut1, Aig_IsComplement(pFanin0), Aig_IsComplement(pFanin1) );

        // minimize support of the cut
        if ( !fSkipTtMin && Dar_CutSuppMinimize( pCut ) )
        {
            int RetValue = Dar_CutFilter( pObj, pCut );
            assert( !RetValue );
        }

        // assign the value of the cut
        pCut->Value = Dar_CutFindValue( p, pCut );
        // if the cut contains removed node, do not use it
        if ( pCut->Value == 0 )
        {
            p->nCutsSkipped++;
            pCut->fUsed = 0;
        }
        else if ( pCut->nLeaves < 2 )
            return pCutSet;
    }
    // count the number of nontrivial cuts cuts
    Dar_ObjForEachCut( pObj, pCut, i )
        p->nCutsUsed += pCut->fUsed;
    // discount trivial cut
    p->nCutsUsed--;
    return pCutSet;
}